

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  uVar1 = X->n;
  do {
    uVar3 = uVar1;
    if (uVar3 == 0) break;
    uVar1 = uVar3 - 1;
  } while (X->p[uVar3 - 1] == 0);
  uVar1 = Y->n;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0) break;
    uVar1 = uVar2 - 1;
  } while (Y->p[uVar2 - 1] == 0);
  iVar4 = 0;
  if (uVar2 != 0 || uVar3 != 0) {
    if (uVar2 < uVar3) {
      return X->s;
    }
    if (uVar3 < uVar2) {
      return -Y->s;
    }
    iVar4 = X->s;
    if (iVar4 < 1) {
      if (iVar4 != 0 && 0 < Y->s) {
        return -1;
      }
    }
    else if (Y->s < 0) {
      return 1;
    }
    do {
      bVar5 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar5) {
        return 0;
      }
      if (Y->p[uVar3] < X->p[uVar3]) {
        return iVar4;
      }
    } while (Y->p[uVar3] <= X->p[uVar3]);
    iVar4 = -iVar4;
  }
  return iVar4;
}

Assistant:

int mbedtls_mpi_cmp_mpi( const mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    size_t i, j;

    for( i = X->n; i > 0; i-- )
        if( X->p[i - 1] != 0 )
            break;

    for( j = Y->n; j > 0; j-- )
        if( Y->p[j - 1] != 0 )
            break;

    if( i == 0 && j == 0 )
        return( 0 );

    if( i > j ) return(  X->s );
    if( j > i ) return( -Y->s );

    if( X->s > 0 && Y->s < 0 ) return(  1 );
    if( Y->s > 0 && X->s < 0 ) return( -1 );

    for( ; i > 0; i-- )
    {
        if( X->p[i - 1] > Y->p[i - 1] ) return(  X->s );
        if( X->p[i - 1] < Y->p[i - 1] ) return( -X->s );
    }

    return( 0 );
}